

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Vat * __thiscall capnp::_::anon_unknown_0::TestContext::getVat(TestContext *this,StringPtr name)

{
  Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t> *this_00;
  RefOrVoid<capnp::_::(anonymous_namespace)::TestContext::Vat> pVVar1;
  Type local_30;
  TestContext *local_20;
  TestContext *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (TestContext *)name.content.ptr;
  local_30.name = (StringPtr *)&this_local;
  local_30.this = this;
  local_20 = this;
  this_00 = kj::
            HashMap<kj::StringPtr,kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,decltype(nullptr)>>
            ::
            findOrCreate<kj::StringPtr&,capnp::_::(anonymous_namespace)::TestContext::getVat(kj::StringPtr)::_lambda()_1_>
                      ((HashMap<kj::StringPtr,kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,decltype(nullptr)>>
                        *)&this->vats,(StringPtr *)&this_local,&local_30);
  pVVar1 = kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>::operator*
                     (this_00);
  return pVVar1;
}

Assistant:

Vat& getVat(kj::StringPtr name) {
    // Get or create a vat with the given name. (Name must be a string literal or otherwise
    // outlive the TestContext.)
    return *vats.findOrCreate(name, [&]() -> decltype(vats)::Entry {
      return { name,  kj::heap<Vat>(network.add(name)) };
    });
  }